

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  int *piVar1;
  ImVector<unsigned_short> *pIVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  ImGuiKey key;
  unsigned_short *puVar6;
  int iVar7;
  undefined8 uVar8;
  ImGuiInputEventMousePos IVar9;
  bool bVar10;
  bool bVar11;
  ImGuiIO *pIVar12;
  ImGuiContext *pIVar13;
  uint uVar14;
  int iVar15;
  ImGuiKeyData *pIVar16;
  unsigned_short *__dest;
  ImGuiInputEvent *pIVar17;
  char *pcVar18;
  ImGuiInputEvent *pIVar19;
  long lVar20;
  char cVar21;
  int n;
  int iVar22;
  bool bVar23;
  undefined7 in_register_00000039;
  char *pcVar24;
  bool bVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  char *pcVar29;
  ulong uVar30;
  undefined8 *puVar31;
  bool bVar32;
  undefined4 uVar33;
  ImBitArray<652,_0> key_changed_mask;
  uint local_88 [22];
  
  pIVar13 = GImGui;
  if ((int)CONCAT71(in_register_00000039,trickle_fast_inputs) == 0) {
    bVar32 = false;
  }
  else {
    bVar32 = GImGui->WantTextInputNextFrame == 1;
  }
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0x14] = 0;
  if ((GImGui->InputEventsQueue).Size < 1) {
LAB_001e8630:
    uVar26 = (pIVar13->InputEventsQueue).Size;
    uVar14 = 0;
  }
  else {
    pIVar12 = &GImGui->IO;
    lVar27 = 0;
    uVar30 = 0;
    bVar11 = false;
    bVar10 = false;
    bVar23 = false;
    bVar25 = false;
    uVar26 = 0;
    do {
      pIVar17 = (pIVar13->InputEventsQueue).Data;
      switch(*(undefined4 *)((long)&pIVar17->Type + lVar27)) {
      case 1:
        if ((trickle_fast_inputs) && ((((uVar26 != 0 || (bVar10)) || (bVar23)) || (bVar25)))) {
LAB_001e82fc:
          if (uVar30 == 0) goto LAB_001e8630;
          goto LAB_001e8305;
        }
        (pIVar13->IO).MousePos = *(ImVec2 *)((long)&pIVar17->field_2 + lVar27);
        bVar11 = true;
        break;
      case 2:
        if ((trickle_fast_inputs) && (uVar26 != 0 || bVar11)) goto LAB_001e82fc;
        (pIVar13->IO).MouseWheelH =
             *(float *)((long)&pIVar17->field_2 + lVar27) + (pIVar13->IO).MouseWheelH;
        (pIVar13->IO).MouseWheel =
             *(float *)((long)&pIVar17->field_2 + lVar27 + 4) + (pIVar13->IO).MouseWheel;
        bVar10 = true;
        break;
      case 3:
        iVar22 = *(int *)((long)&pIVar17->field_2 + lVar27);
        uVar14 = 1 << ((byte)iVar22 & 0x1f);
        if ((trickle_fast_inputs) && (((uVar14 & uVar26) != 0 || (bVar10)))) goto LAB_001e82fc;
        (pIVar13->IO).MouseDown[iVar22] = *(bool *)((long)&pIVar17->field_2 + lVar27 + 4);
        uVar26 = uVar26 | uVar14;
        break;
      case 4:
        key = *(ImGuiKey *)((long)&pIVar17->field_2 + lVar27);
        pIVar16 = GetKeyData(key);
        uVar28 = (ulong)((long)pIVar16 - (long)pIVar12->KeysData) >> 4;
        uVar14 = (uint)uVar28;
        if (trickle_fast_inputs) {
          cVar5 = *(char *)((long)&pIVar17->field_2 + lVar27 + 4);
          cVar21 = pIVar16->Down;
          if ((pIVar16->Down != (bool)cVar5) &&
             ((((local_88[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) != 0 || (bVar25)) ||
              (cVar21 = cVar5, uVar26 != 0)))) goto LAB_001e82fc;
        }
        else {
          cVar21 = *(char *)((long)&pIVar17->field_2 + lVar27 + 4);
        }
        pIVar16->Down = (bool)cVar21;
        pIVar16->AnalogValue = *(float *)((long)&pIVar17->field_2 + lVar27 + 8);
        local_88[(int)uVar14 >> 5] = local_88[(int)uVar14 >> 5] | 1 << ((byte)uVar28 & 0x1f);
        switch(key << 0x14 | key - ImGuiKey_ModCtrl >> 0xc) {
        case ImGuiKey_KeysData_OFFSET:
          (pIVar13->IO).KeyCtrl = (bool)cVar21;
          if (key == ImGuiKey_ModSuper) break;
          if (key == ImGuiKey_ModAlt) {
LAB_001e816a:
            (pIVar13->IO).KeyAlt = pIVar16->Down;
          }
          else if (key == ImGuiKey_ModShift) {
            (pIVar13->IO).KeyShift = pIVar16->Down;
          }
          goto LAB_001e818b;
        case 1:
          (pIVar13->IO).KeyShift = (bool)cVar21;
          if (key != ImGuiKey_ModSuper) {
            if (key == ImGuiKey_ModAlt) goto LAB_001e816a;
            goto LAB_001e818b;
          }
          break;
        default:
          goto switchD_001e80aa_caseD_2;
        case 3:
          (pIVar13->IO).KeyAlt = (bool)cVar21;
          if (key != ImGuiKey_ModSuper) goto LAB_001e818b;
          break;
        case 7:
          break;
        }
        (pIVar13->IO).KeySuper = pIVar16->Down;
LAB_001e818b:
        iVar22 = (uint)(GImGui->IO).KeyCtrl * 0x1000;
        iVar15 = iVar22 + 0x2000;
        if ((GImGui->IO).KeyShift == false) {
          iVar15 = iVar22;
        }
        iVar22 = iVar15 + 0x4000;
        if ((GImGui->IO).KeyAlt == false) {
          iVar22 = iVar15;
        }
        iVar15 = iVar22 + 0x8000;
        if ((GImGui->IO).KeySuper == false) {
          iVar15 = iVar22;
        }
        (pIVar13->IO).KeyMods = iVar15;
        cVar21 = pIVar16->Down;
switchD_001e80aa_caseD_2:
        (pIVar13->IO).KeysDown[(int)uVar14] = (bool)cVar21;
        lVar20 = (long)(pIVar13->IO).KeyMap[(int)uVar14];
        bVar23 = true;
        if (lVar20 != -1) {
          (pIVar13->IO).KeysDown[lVar20] = pIVar16->Down;
        }
        break;
      case 5:
        if (trickle_fast_inputs) {
          if (bVar23) {
            if (uVar26 == 0 && !bVar32) {
LAB_001e80ef:
              if ((!bVar11) && (!bVar10)) goto LAB_001e8104;
            }
          }
          else if (uVar26 == 0) goto LAB_001e80ef;
          goto LAB_001e82fc;
        }
LAB_001e8104:
        uVar14 = *(uint *)((long)&pIVar17->field_2 + lVar27);
        if (0xffff < uVar14) {
          uVar14 = 0xfffd;
        }
        iVar22 = (pIVar13->IO).InputQueueCharacters.Size;
        if (iVar22 == (pIVar13->IO).InputQueueCharacters.Capacity) {
          if (iVar22 == 0) {
            iVar15 = 8;
          }
          else {
            iVar15 = iVar22 / 2 + iVar22;
          }
          iVar7 = iVar22 + 1;
          if (iVar22 + 1 < iVar15) {
            iVar7 = iVar15;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar7 * 2,GImAllocatorUserData);
          puVar6 = (pIVar13->IO).InputQueueCharacters.Data;
          if (puVar6 != (unsigned_short *)0x0) {
            memcpy(__dest,puVar6,(long)(pIVar13->IO).InputQueueCharacters.Size * 2);
            puVar6 = (pIVar13->IO).InputQueueCharacters.Data;
            if ((puVar6 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
          }
          (pIVar13->IO).InputQueueCharacters.Data = __dest;
          (pIVar13->IO).InputQueueCharacters.Capacity = iVar7;
          iVar22 = (pIVar13->IO).InputQueueCharacters.Size;
        }
        else {
          __dest = (pIVar13->IO).InputQueueCharacters.Data;
        }
        __dest[iVar22] = (unsigned_short)uVar14;
        pIVar2 = &(pIVar13->IO).InputQueueCharacters;
        pIVar2->Size = pIVar2->Size + 1;
        if (bVar32) {
          bVar25 = true;
        }
        break;
      case 6:
        (pIVar13->IO).AppFocusLost = (bool)(*(byte *)((long)&pIVar17->field_2 + lVar27) ^ 1);
      }
      uVar30 = uVar30 + 1;
      lVar27 = lVar27 + 0x18;
    } while ((long)uVar30 < (long)(pIVar13->InputEventsQueue).Size);
LAB_001e8305:
    iVar22 = (pIVar13->InputEventsTrail).Size;
    lVar27 = 0;
    uVar28 = uVar30 & 0xffffffff;
    do {
      puVar31 = (undefined8 *)((long)&((pIVar13->InputEventsQueue).Data)->Type + lVar27);
      if (iVar22 == (pIVar13->InputEventsTrail).Capacity) {
        if (iVar22 == 0) {
          iVar15 = 8;
        }
        else {
          iVar15 = iVar22 / 2 + iVar22;
        }
        iVar7 = iVar22 + 1;
        if (iVar22 + 1 < iVar15) {
          iVar7 = iVar15;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar17 = (ImGuiInputEvent *)
                  (*GImAllocatorAllocFunc)((long)iVar7 * 0x18,GImAllocatorUserData);
        pIVar19 = (pIVar13->InputEventsTrail).Data;
        if (pIVar19 != (ImGuiInputEvent *)0x0) {
          memcpy(pIVar17,pIVar19,(long)(pIVar13->InputEventsTrail).Size * 0x18);
          pIVar19 = (pIVar13->InputEventsTrail).Data;
          if ((pIVar19 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
        }
        (pIVar13->InputEventsTrail).Data = pIVar17;
        (pIVar13->InputEventsTrail).Capacity = iVar7;
        iVar22 = (pIVar13->InputEventsTrail).Size;
      }
      else {
        pIVar17 = (pIVar13->InputEventsTrail).Data;
      }
      *(undefined8 *)((long)&pIVar17[iVar22].field_2 + 8) = puVar31[2];
      uVar8 = *puVar31;
      IVar9 = *(ImGuiInputEventMousePos *)(puVar31 + 1);
      pIVar17 = pIVar17 + iVar22;
      pIVar17->Type = (int)uVar8;
      pIVar17->Source = (int)((ulong)uVar8 >> 0x20);
      (pIVar17->field_2).MousePos = IVar9;
      iVar22 = (pIVar13->InputEventsTrail).Size + 1;
      (pIVar13->InputEventsTrail).Size = iVar22;
      lVar27 = lVar27 + 0x18;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
    uVar26 = (pIVar13->InputEventsQueue).Size;
    if ((0 < (int)uVar26 & (byte)pIVar13->DebugLogFlags >> 5) == 1) {
      lVar27 = 0xc;
      uVar28 = 0;
      do {
        pcVar29 = "Remaining";
        if (uVar28 < (uVar30 & 0xffffffff)) {
          pcVar29 = "Processed";
        }
        pIVar17 = (pIVar13->InputEventsQueue).Data;
        switch(*(undefined4 *)((long)pIVar17 + lVar27 + -0xc)) {
        case 1:
          fVar4 = *(float *)((long)pIVar17 + lVar27 + -4);
          if (((fVar4 != -3.4028235e+38) || (NAN(fVar4))) ||
             ((fVar3 = *(float *)((long)&pIVar17->Type + lVar27), fVar3 != -3.4028235e+38 ||
              (NAN(fVar3))))) {
            if ((GImGui->DebugLogFlags & 0x20) != 0) {
              uVar33 = SUB84((double)fVar4,0);
              fVar4 = *(float *)((long)&pIVar17->Type + lVar27);
              pcVar24 = "%s: MousePos (%.1f, %.1f)\n";
              goto LAB_001e85f3;
            }
          }
          else if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: MousePos (-FLT_MAX, -FLT_MAX)\n",pcVar29);
          }
          break;
        case 2:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            uVar33 = SUB84((double)*(float *)((long)pIVar17 + lVar27 + -4),0);
            fVar4 = *(float *)((long)&pIVar17->Type + lVar27);
            pcVar24 = "%s: MouseWheel (%.1f, %.1f)\n";
LAB_001e85f3:
            DebugLog(pcVar24,uVar33,(double)fVar4,pcVar29);
          }
          break;
        case 3:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            pcVar24 = "GamepadDpadUp";
            if (*(char *)((long)&pIVar17->Type + lVar27) != '\0') {
              pcVar24 = "GamepadDpadDown";
            }
            DebugLog("%s: MouseButton %d %s\n",pcVar29,(ulong)*(uint *)((long)pIVar17 + lVar27 + -4)
                     ,pcVar24 + 0xb);
          }
          break;
        case 4:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            pcVar18 = GetKeyName(*(ImGuiKey *)((long)pIVar17 + lVar27 + -4));
            pcVar24 = "GamepadDpadUp";
            if (*(char *)((long)&pIVar17->Type + lVar27) != '\0') {
              pcVar24 = "GamepadDpadDown";
            }
            DebugLog("%s: Key \"%s\" %s\n",pcVar29,pcVar18,pcVar24 + 0xb);
          }
          break;
        case 5:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: Text: %c (U+%08X)\n",pcVar29,(ulong)*(uint *)((long)pIVar17 + lVar27 + -4)
                    );
          }
          break;
        case 6:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: AppFocused %d\n",pcVar29,(ulong)*(byte *)((long)pIVar17 + lVar27 + -4));
          }
        }
        uVar28 = uVar28 + 1;
        uVar26 = (pIVar13->InputEventsQueue).Size;
        lVar27 = lVar27 + 0x18;
      } while ((long)uVar28 < (long)(int)uVar26);
    }
    uVar14 = (uint)uVar30;
  }
  if (uVar14 == uVar26) {
    iVar22 = 0;
    if ((pIVar13->InputEventsQueue).Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      iVar22 = 0;
      pIVar19 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      pIVar17 = (pIVar13->InputEventsQueue).Data;
      if (pIVar17 != (ImGuiInputEvent *)0x0) {
        memcpy(pIVar19,pIVar17,(long)(pIVar13->InputEventsQueue).Size * 0x18);
        pIVar17 = (pIVar13->InputEventsQueue).Data;
        if ((pIVar17 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
      }
      (pIVar13->InputEventsQueue).Data = pIVar19;
      (pIVar13->InputEventsQueue).Capacity = 0;
    }
  }
  else {
    pIVar17 = (pIVar13->InputEventsQueue).Data;
    memmove(pIVar17,pIVar17 + uVar14,((long)(int)uVar26 - (ulong)uVar14) * 0x18);
    iVar22 = (pIVar13->InputEventsQueue).Size - uVar14;
  }
  (pIVar13->InputEventsQueue).Size = iVar22;
  if ((pIVar13->IO).AppFocusLost == true) {
    ImGuiIO::ClearInputKeys(&pIVar13->IO);
    return;
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            // Trickling Rule: Stop processing queued events if we already handled a mouse button change
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                break;
            io.MousePos = event_pos;
            mouse_moved = true;
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                break;
            io.MouseDown[button] = e->MouseButton.Down;
            mouse_button_changed |= (1 << button);
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the event
            if (trickle_fast_inputs && (mouse_moved || mouse_button_changed != 0))
                break;
            io.MouseWheelH += e->MouseWheel.WheelX;
            io.MouseWheel += e->MouseWheel.WheelY;
            mouse_wheeled = true;
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            ImGuiKeyData* key_data = GetKeyData(key);
            const int key_data_index = (int)(key_data - g.IO.KeysData);
            if (trickle_fast_inputs && key_data->Down != e->Key.Down && (key_changed_mask.TestBit(key_data_index) || text_inputted || mouse_button_changed != 0))
                break;
            key_data->Down = e->Key.Down;
            key_data->AnalogValue = e->Key.AnalogValue;
            key_changed = true;
            key_changed_mask.SetBit(key_data_index);

            if (key == ImGuiMod_Ctrl || key == ImGuiMod_Shift || key == ImGuiMod_Alt || key == ImGuiMod_Super)
            {
                if (key == ImGuiMod_Ctrl) { io.KeyCtrl = key_data->Down; }
                if (key == ImGuiMod_Shift) { io.KeyShift = key_data->Down; }
                if (key == ImGuiMod_Alt) { io.KeyAlt = key_data->Down; }
                if (key == ImGuiMod_Super) { io.KeySuper = key_data->Down; }
                io.KeyMods = GetMergedModsFromBools();
            }

            // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
            io.KeysDown[key_data_index] = key_data->Down;
            if (io.KeyMap[key_data_index] != -1)
                io.KeysDown[io.KeyMap[key_data_index]] = key_data->Down;
#endif
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process in NewFrame(), in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            const bool focus_lost = !e->AppFocused.Focused;
            io.AppFocusLost = focus_lost;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG_IO("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (event_n != 0 && (g.DebugLogFlags & ImGuiDebugLogFlags_EventIO))
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugPrintInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);
#endif

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // - this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle.
    // - we clear in EndFrame() and not now in order allow application/user code polling this flag
    //   (e.g. custom backend may want to clear additional data, custom widgets may want to react with a "canceling" event).
    if (g.IO.AppFocusLost)
        g.IO.ClearInputKeys();
}